

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall CVmObjLookupTable::populate_from_list(CVmObjLookupTable *this,vm_val_t *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vm_val_t key;
  vm_val_t val;
  vm_val_t local_60;
  vm_val_t local_50;
  vm_val_t local_40;
  
  iVar1 = vm_val_t::ll_length(src);
  iVar3 = 1;
  iVar2 = iVar3;
  if (1 < iVar1) {
    do {
      local_60.typ = VM_INT;
      local_60.val.intval = iVar2;
      vm_val_t::ll_index(src,&local_50,&local_60);
      iVar3 = iVar2 + 2;
      local_60.typ = VM_INT;
      local_60.val.obj = iVar2 + 1;
      vm_val_t::ll_index(src,&local_40,&local_60);
      set_or_add_entry(this,&local_50,&local_40);
      iVar2 = iVar3;
    } while (iVar3 < iVar1);
  }
  if (iVar3 <= iVar1) {
    local_60.typ = VM_INT;
    local_60.val.intval = iVar3;
    vm_val_t::ll_index(src,(vm_val_t *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 0x10),
                       &local_60);
  }
  return;
}

Assistant:

void CVmObjLookupTable::populate_from_list(VMG_ const vm_val_t *src)
{
    /* copy elements from the source object */
    int cnt = src->ll_length(vmg0_);
    int i;
    for (i = 1 ; i + 1 <= cnt ; )
    {
        vm_val_t key, val;

        /* get the next two elements - they're always key, value pairs */
        src->ll_index(vmg_ &key, i++);
        src->ll_index(vmg_ &val, i++);

        /* set them in the table */
        set_or_add_entry(vmg_ &key, &val);
    }

    /* if there's a single remaining entry, it's the default value */
    if (i <= cnt)
        src->ll_index(vmg_ &get_ext()->default_value, i);
}